

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAdda<(moira::Instr)5,(moira::Mode)4,(moira::Size)2>(Moira *this,u16 opcode)

{
  int *piVar1;
  int iVar2;
  u32 uVar3;
  u32 uVar4;
  ulong uVar5;
  bool error;
  bool local_29;
  
  uVar3 = computeEA<(moira::Mode)4,(moira::Size)2,0ul>(this,opcode & 7);
  uVar3 = readM<(moira::MemSpace)1,(moira::Size)2,64ul>(this,uVar3,&local_29);
  piVar1 = (int *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x38);
  *piVar1 = *piVar1 + -2;
  if (local_29 == false) {
    uVar5 = (ulong)(opcode >> 9 & 7);
    iVar2 = *(int *)((long)this->exec + uVar5 * 4 + -0x38);
    uVar4 = (this->reg).pc;
    (this->reg).pc0 = uVar4;
    (this->queue).ird = (this->queue).irc;
    uVar4 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar4 + 2);
    (this->queue).irc = (u16)uVar4;
    (*this->_vptr_Moira[0x19])(this,2);
    (*this->_vptr_Moira[0x19])(this,2);
    *(int *)((long)this->exec + uVar5 * 4 + -0x38) = (short)uVar3 + iVar2;
  }
  return;
}

Assistant:

void
Moira::execAdda(u16 opcode)
{
    u32 ea, data, result;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;
    data = SEXT<S>(data);

    result = (I == ADDA) ? readA(dst) + data : readA(dst) - data;
    prefetch<POLLIPL>();

    sync(2);
    if (S == Word || isRegMode(M) || isImmMode(M)) sync(2);
    writeA(dst, result);
}